

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O1

Raster * rw::gl3::rasterCreate(Raster *raster)

{
  long lVar1;
  
  lVar1 = (long)nativeRasterOffset;
  *(undefined2 *)((long)&raster->width + lVar1) = 0;
  *(undefined1 *)((long)&raster->width + lVar1 + 3) = 1;
  if ((raster->width == 0) || (raster->height == 0)) {
    *(byte *)&raster->flags = (byte)raster->flags | 0x80;
    raster->stride = 0;
  }
  else if ((raster->flags & 0x80) == 0) {
    rasterCreate();
    return (Raster *)0x0;
  }
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return raster;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	natras->isCompressed = 0;
	natras->hasAlpha = 0;
	natras->numLevels = 1;

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
#ifdef RW_OPENGL
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}